

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O2

SampleBuilder * __thiscall tcu::SampleBuilder::operator<<(SampleBuilder *this,deInt64 v)

{
  Value local_18;
  
  local_18.type = TYPE_INT64;
  local_18.value.int64 = v;
  std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
  emplace_back<tcu::SampleBuilder::Value>(&this->m_values,&local_18);
  return this;
}

Assistant:

SampleBuilder&			operator<<			(deInt64 v)	{ m_values.push_back(Value(v));				return *this; }